

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

char ** doEnumStringList(_func_void_PHYSFS_StringCallback_void_ptr *func)

{
  _func_void_PHYSFS_StringCallback_void_ptr *local_28;
  EnumStringListCallbackData ecd;
  _func_void_PHYSFS_StringCallback_void_ptr *func_local;
  
  ecd._8_8_ = func;
  memset(&local_28,0,0x10);
  local_28 = (_func_void_PHYSFS_StringCallback_void_ptr *)(*__PHYSFS_AllocatorHooks.Malloc)(8);
  if (local_28 == (_func_void_PHYSFS_StringCallback_void_ptr *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    func_local = (_func_void_PHYSFS_StringCallback_void_ptr *)0x0;
  }
  else {
    (*(code *)ecd._8_8_)(enumStringListCallback,&local_28);
    if (ecd.list._4_4_ == PHYSFS_ERR_OK) {
      *(undefined8 *)(local_28 + (ulong)(uint)ecd.list * 8) = 0;
      func_local = local_28;
    }
    else {
      PHYSFS_setErrorCode(ecd.list._4_4_);
      func_local = (_func_void_PHYSFS_StringCallback_void_ptr *)0x0;
    }
  }
  return (char **)func_local;
}

Assistant:

static char **doEnumStringList(void (*func)(PHYSFS_StringCallback, void *))
{
    EnumStringListCallbackData ecd;
    memset(&ecd, '\0', sizeof (ecd));
    ecd.list = (char **) allocator.Malloc(sizeof (char *));
    BAIL_IF(!ecd.list, PHYSFS_ERR_OUT_OF_MEMORY, NULL);
    func(enumStringListCallback, &ecd);

    if (ecd.errcode)
    {
        PHYSFS_setErrorCode(ecd.errcode);
        return NULL;
    } /* if */

    ecd.list[ecd.size] = NULL;
    return ecd.list;
}